

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O1

PVG_FT_Error
PVG_FT_Stroker_CubicTo
          (PVG_FT_Stroker stroker,PVG_FT_Vector *control1,PVG_FT_Vector *control2,PVG_FT_Vector *to)

{
  PVG_FT_Pos PVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  PVG_FT_Angle angle1;
  PVG_FT_Angle PVar5;
  ulong uVar6;
  ulong uVar7;
  PVG_FT_Angle PVar8;
  PVG_FT_Angle PVar9;
  PVG_FT_Angle PVar10;
  PVG_FT_Angle PVar11;
  PVG_FT_Fixed PVar12;
  PVG_FT_Fixed PVar13;
  PVG_FT_Long PVar14;
  long lVar15;
  long lVar16;
  PVG_FT_StrokeBorder border;
  long lVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  PVG_FT_Vector end;
  PVG_FT_Vector ctrl2;
  PVG_FT_Vector ctrl1;
  PVG_FT_Vector start;
  PVG_FT_Vector delta;
  PVG_FT_Vector bvec;
  PVG_FT_Vector bez_stack [37];
  PVG_FT_Pos *local_370;
  PVG_FT_Vector local_348;
  PVG_FT_Vector *local_338;
  long local_330;
  long local_328;
  PVG_FT_Angle local_320;
  ulong local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  PVG_FT_Vector local_2e8;
  PVG_FT_Vector local_2d8;
  PVG_FT_Vector local_2c8;
  PVG_FT_StrokeBorder local_2b0;
  PVG_FT_Vector local_2a8;
  PVG_FT_Vector local_298;
  PVG_FT_Pos local_288 [4];
  PVG_FT_Pos local_268;
  PVG_FT_Pos PStack_260;
  PVG_FT_Pos local_258;
  PVG_FT_Pos PStack_250;
  
  local_338 = &stroker->center;
  if (((((((stroker->center).x - control1->x) + 1U < 3) &&
        (((stroker->center).y - control1->y) + 1U < 3)) && ((control1->x - control2->x) + 1U < 3))
      && (((control1->y - control2->y) + 1U < 3 && ((control2->x - to->x) + 1U < 3)))) &&
     ((control2->y - to->y) + 1U < 3)) {
    PVar1 = to->y;
    local_338->x = to->x;
    (stroker->center).y = PVar1;
  }
  else {
    local_370 = local_288;
    local_288[0] = to->x;
    local_288[1] = to->y;
    local_288[2] = control2->x;
    local_288[3] = control2->y;
    local_268 = control1->x;
    PStack_260 = control1->y;
    local_258 = local_338->x;
    PStack_250 = (stroker->center).y;
    local_2b0 = stroker->borders;
    bVar3 = true;
    uVar19 = 0;
    do {
      angle1 = stroker->angle_in;
      PVar5 = angle1;
      PVar11 = angle1;
      local_318 = uVar19;
      if (uVar19 < 0x200) {
        local_328 = local_370[4];
        local_310 = local_370[6];
        local_300 = local_370[5];
        local_2f8 = local_370[7];
        local_2f0 = local_370[1];
        local_320 = local_370[2];
        lVar15 = local_320 - local_328;
        lVar16 = local_370[3];
        lVar17 = lVar16 - local_300;
        local_308 = *(long *)((long)local_288 + uVar19);
        lVar18 = local_308 - local_320;
        local_330 = local_2f0 - lVar16;
        bVar20 = 2 < lVar15 + 1U;
        bVar21 = 2 < lVar17 + 1U;
        bVar22 = 2 < lVar18 + 1U;
        bVar23 = 2 < local_330 + 1U;
        if ((local_300 - local_2f8) + 1U < 3 && (local_328 - local_310) + 1U < 3) {
          if (bVar21 || bVar20) {
            angle1 = PVG_FT_Atan2(lVar15,lVar17);
            PVar5 = angle1;
            PVar11 = angle1;
            if (bVar23 || bVar22) {
              PVar11 = PVG_FT_Atan2(lVar18,local_330);
            }
          }
          else if (bVar23 || bVar22) {
            angle1 = PVG_FT_Atan2(lVar18,local_330);
            PVar5 = angle1;
            PVar11 = angle1;
          }
        }
        else {
          angle1 = PVG_FT_Atan2(local_328 - local_310,local_300 - local_2f8);
          if (bVar21 || bVar20) {
            PVar5 = PVG_FT_Atan2(lVar15,lVar17);
            PVar11 = PVar5;
            if (bVar23 || bVar22) {
              PVar11 = PVG_FT_Atan2(lVar18,local_330);
            }
          }
          else {
            PVar5 = angle1;
            PVar11 = angle1;
            if (bVar23 || bVar22) {
              PVar11 = PVG_FT_Atan2(lVar18,local_330);
              PVar5 = PVG_FT_Angle_Diff(angle1,PVar11);
              PVar5 = PVar5 / 2 + angle1;
            }
          }
        }
        uVar6 = PVG_FT_Angle_Diff(angle1,PVar5);
        uVar19 = -uVar6;
        if (0 < (long)uVar6) {
          uVar19 = uVar6;
        }
        uVar7 = PVG_FT_Angle_Diff(PVar5,PVar11);
        uVar6 = -uVar7;
        if (0 < (long)uVar7) {
          uVar6 = uVar7;
        }
        if ((uVar19 < 0x168000) && (uVar6 < 0x168000)) goto LAB_0013d72f;
        if (stroker->first_point != '\0') {
          stroker->angle_in = angle1;
        }
        local_370[0xc] = local_310;
        lVar15 = local_320 + local_328 + local_310 + local_328;
        local_370[10] = local_310 + local_328 >> 1;
        lVar17 = local_320 + local_328 + local_308 + local_320;
        local_370[8] = lVar15 >> 2;
        local_370[2] = local_308 + local_320 >> 1;
        local_370[4] = lVar17 >> 2;
        local_370[6] = lVar17 + lVar15 >> 3;
        local_370[0xd] = local_2f8;
        lVar15 = lVar16 + local_300 + local_2f8 + local_300;
        local_370[0xb] = local_2f8 + local_300 >> 1;
        lVar17 = lVar16 + local_300 + local_2f0 + lVar16;
        local_370[9] = lVar15 >> 2;
        local_370[3] = local_2f0 + lVar16 >> 1;
        local_370[5] = lVar17 >> 2;
        local_370[7] = lVar17 + lVar15 >> 3;
        uVar19 = local_318 + 0x30;
        iVar4 = 3;
      }
      else {
LAB_0013d72f:
        if (bVar3) {
          if (stroker->first_point == '\0') {
            stroker->angle_out = angle1;
            ft_stroker_process_corner(stroker,0);
          }
          else {
            ft_stroker_subpath_start(stroker,angle1,0);
          }
        }
        else {
          uVar6 = PVG_FT_Angle_Diff(stroker->angle_in,angle1);
          uVar19 = -uVar6;
          if (0 < (long)uVar6) {
            uVar19 = uVar6;
          }
          if (0x5a000 < uVar19) {
            PVar1 = local_370[7];
            local_338->x = local_370[6];
            local_338->y = PVar1;
            stroker->angle_out = angle1;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;
            ft_stroker_process_corner(stroker,0);
            stroker->line_join = stroker->line_join_saved;
          }
        }
        PVar8 = PVG_FT_Angle_Diff(angle1,PVar5);
        PVar9 = PVG_FT_Angle_Diff(PVar5,PVar11);
        PVar10 = PVG_FT_Angle_Diff(angle1,PVar5);
        local_328 = PVar11;
        PVar11 = PVG_FT_Angle_Diff(PVar5,PVar11);
        PVar14 = stroker->radius;
        PVar12 = PVG_FT_Cos(PVar8 / 2);
        local_2f0 = PVG_FT_DivFix(PVar14,PVar12);
        PVar14 = stroker->radius;
        PVar12 = PVG_FT_Cos(PVar9 / 2);
        local_2f8 = PVG_FT_DivFix(PVar14,PVar12);
        uVar19 = local_318;
        if (stroker->handle_wide_strokes == '\0') {
          local_320 = 0;
        }
        else {
          local_320 = PVG_FT_Atan2(*(long *)((long)local_288 + local_318) - local_370[6],
                                   local_370[1] - local_370[7]);
        }
        local_300 = local_328 + 0x5a0000;
        lVar16 = 0;
        border = local_2b0;
        do {
          PVG_FT_Vector_From_Polar(&local_2d8,local_2f0,angle1 + PVar10 / 2 + 0x5a0000 + lVar16);
          local_2d8.x = local_2d8.x + local_370[4];
          local_2d8.y = local_2d8.y + local_370[5];
          PVG_FT_Vector_From_Polar(&local_2e8,local_2f8,PVar5 + PVar11 / 2 + 0x5a0000 + lVar16);
          local_2e8.x = local_2e8.x + local_370[2];
          local_2e8.y = local_2e8.y + local_370[3];
          PVG_FT_Vector_From_Polar(&local_348,stroker->radius,local_300 + lVar16);
          lVar15 = *(long *)((long)local_288 + uVar19);
          local_348.x = local_348.x + lVar15;
          lVar17 = local_370[1];
          local_348.y = local_348.y + lVar17;
          if (stroker->handle_wide_strokes == '\0') {
LAB_0013dc16:
            ft_stroke_border_cubicto(border,&local_2d8,&local_2e8,&local_348);
          }
          else {
            lVar18 = border->points[border->num_points - 1].x;
            lVar2 = border->points[border->num_points - 1].y;
            local_2c8.x = lVar18;
            local_2c8.y = lVar2;
            PVar8 = PVG_FT_Atan2(local_348.x - lVar18,local_348.y - lVar2);
            uVar6 = PVG_FT_Angle_Diff(local_320,PVar8);
            uVar19 = -uVar6;
            if (0 < (long)uVar6) {
              uVar19 = uVar6;
            }
            iVar4 = 0;
            if (0x5a0000 < uVar19) {
              local_308 = lVar18;
              local_310 = PVG_FT_Atan2(local_370[6] - lVar18,local_370[7] - lVar2);
              PVar9 = PVG_FT_Atan2(lVar15 - local_348.x,lVar17 - local_348.y);
              local_298.x = local_348.x - lVar18;
              local_298.y = local_348.y - lVar2;
              PVar12 = PVG_FT_Vector_Length(&local_298);
              PVar13 = PVG_FT_Sin(PVar8 - PVar9);
              lVar15 = local_310;
              lVar17 = -PVar13;
              if (0 < PVar13) {
                lVar17 = PVar13;
              }
              PVar13 = PVG_FT_Sin(local_310 - PVar9);
              lVar18 = -PVar13;
              if (0 < PVar13) {
                lVar18 = PVar13;
              }
              PVar14 = PVG_FT_MulDiv(PVar12,lVar17,lVar18);
              PVG_FT_Vector_From_Polar(&local_2a8,PVar14,lVar15);
              local_2a8.x = local_2a8.x + local_308;
              local_2a8.y = local_2a8.y + lVar2;
              border->movable = '\0';
              ft_stroke_border_lineto(border,&local_2a8,'\0');
              ft_stroke_border_lineto(border,&local_348,'\0');
              ft_stroke_border_cubicto(border,&local_2e8,&local_2d8,&local_2c8);
              ft_stroke_border_lineto(border,&local_348,'\0');
              iVar4 = 7;
            }
            uVar19 = local_318;
            if (iVar4 != 7) {
              if (iVar4 == 0) goto LAB_0013dc16;
              goto LAB_0013dc4c;
            }
          }
          border = border + 1;
          lVar16 = lVar16 + -0xb40000;
        } while (lVar16 == -0xb40000);
        iVar4 = 0;
LAB_0013dc4c:
        bVar3 = false;
        if (iVar4 == 0) {
          uVar19 = uVar19 - 0x30;
          stroker->angle_in = local_328;
          iVar4 = 0;
        }
      }
      if ((iVar4 != 3) && (iVar4 != 0)) {
        return 0;
      }
      local_370 = (PVG_FT_Pos *)((long)local_288 + uVar19);
    } while (-1 < (long)uVar19);
    PVar1 = to->y;
    local_338->x = to->x;
    local_338->y = PVar1;
    stroker->line_length = 0;
  }
  return 0;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_CubicTo(PVG_FT_Stroker stroker, PVG_FT_Vector* control1,
                                  PVG_FT_Vector* control2, PVG_FT_Vector* to)
{
    PVG_FT_Error   error = 0;
    PVG_FT_Vector  bez_stack[37];
    PVG_FT_Vector* arc;
    PVG_FT_Vector* limit = bez_stack + 32;
    PVG_FT_Bool    first_arc = TRUE;

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner */
    if (PVG_FT_IS_SMALL(stroker->center.x - control1->x) &&
        PVG_FT_IS_SMALL(stroker->center.y - control1->y) &&
        PVG_FT_IS_SMALL(control1->x - control2->x) &&
        PVG_FT_IS_SMALL(control1->y - control2->y) &&
        PVG_FT_IS_SMALL(control2->x - to->x) &&
        PVG_FT_IS_SMALL(control2->y - to->y)) {
        stroker->center = *to;
        goto Exit;
    }

    arc = bez_stack;
    arc[0] = *to;
    arc[1] = *control2;
    arc[2] = *control1;
    arc[3] = stroker->center;

    while (arc >= bez_stack) {
        PVG_FT_Angle angle_in, angle_mid, angle_out;

        /* initialize with current direction */
        angle_in = angle_out = angle_mid = stroker->angle_in;

        if (arc < limit &&
            !ft_cubic_is_small_enough(arc, &angle_in, &angle_mid, &angle_out)) {
            if (stroker->first_point) stroker->angle_in = angle_in;

            ft_cubic_split(arc);
            arc += 3;
            continue;
        }

        if (first_arc) {
            first_arc = FALSE;

            /* process corner if necessary */
            if (stroker->first_point)
                error = ft_stroker_subpath_start(stroker, angle_in, 0);
            else {
                stroker->angle_out = angle_in;
                error = ft_stroker_process_corner(stroker, 0);
            }
        } else if (ft_pos_abs(PVG_FT_Angle_Diff(stroker->angle_in, angle_in)) >
                   PVG_FT_SMALL_CUBIC_THRESHOLD / 4) {
            /* if the deviation from one arc to the next is too great, */
            /* add a round corner                                      */
            stroker->center = arc[3];
            stroker->angle_out = angle_in;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;

            error = ft_stroker_process_corner(stroker, 0);

            /* reinstate line join style */
            stroker->line_join = stroker->line_join_saved;
        }

        if (error) goto Exit;

        /* the arc's angle is small enough; we can add it directly to each */
        /* border                                                          */
        {
            PVG_FT_Vector       ctrl1, ctrl2, end;
            PVG_FT_Angle        theta1, phi1, theta2, phi2, rotate, alpha0 = 0;
            PVG_FT_Fixed        length1, length2;
            PVG_FT_StrokeBorder border;
            PVG_FT_Int          side;

            theta1 = PVG_FT_Angle_Diff(angle_in, angle_mid) / 2;
            theta2 = PVG_FT_Angle_Diff(angle_mid, angle_out) / 2;
            phi1 = ft_angle_mean(angle_in, angle_mid);
            phi2 = ft_angle_mean(angle_mid, angle_out);
            length1 = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta1));
            length2 = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta2));

            /* compute direction of original arc */
            if (stroker->handle_wide_strokes)
                alpha0 = PVG_FT_Atan2(arc[0].x - arc[3].x, arc[0].y - arc[3].y);

            for (border = stroker->borders, side = 0; side <= 1;
                 side++, border++) {
                rotate = PVG_FT_SIDE_TO_ROTATE(side);

                /* compute control points */
                PVG_FT_Vector_From_Polar(&ctrl1, length1, phi1 + rotate);
                ctrl1.x += arc[2].x;
                ctrl1.y += arc[2].y;

                PVG_FT_Vector_From_Polar(&ctrl2, length2, phi2 + rotate);
                ctrl2.x += arc[1].x;
                ctrl2.y += arc[1].y;

                /* compute end point */
                PVG_FT_Vector_From_Polar(&end, stroker->radius,
                                        angle_out + rotate);
                end.x += arc[0].x;
                end.y += arc[0].y;

                if (stroker->handle_wide_strokes) {
                    PVG_FT_Vector start;
                    PVG_FT_Angle  alpha1;

                    /* determine whether the border radius is greater than the
                     */
                    /* radius of curvature of the original arc */
                    start = border->points[border->num_points - 1];

                    alpha1 = PVG_FT_Atan2(end.x - start.x, end.y - start.y);

                    /* is the direction of the border arc opposite to */
                    /* that of the original arc? */
                    if (ft_pos_abs(PVG_FT_Angle_Diff(alpha0, alpha1)) >
                        PVG_FT_ANGLE_PI / 2) {
                        PVG_FT_Angle  beta, gamma;
                        PVG_FT_Vector bvec, delta;
                        PVG_FT_Fixed  blen, sinA, sinB, alen;

                        /* use the sine rule to find the intersection point */
                        beta =
                            PVG_FT_Atan2(arc[3].x - start.x, arc[3].y - start.y);
                        gamma = PVG_FT_Atan2(arc[0].x - end.x, arc[0].y - end.y);

                        bvec.x = end.x - start.x;
                        bvec.y = end.y - start.y;

                        blen = PVG_FT_Vector_Length(&bvec);

                        sinA = ft_pos_abs(PVG_FT_Sin(alpha1 - gamma));
                        sinB = ft_pos_abs(PVG_FT_Sin(beta - gamma));

                        alen = PVG_FT_MulDiv(blen, sinA, sinB);

                        PVG_FT_Vector_From_Polar(&delta, alen, beta);
                        delta.x += start.x;
                        delta.y += start.y;

                        /* circumnavigate the negative sector backwards */
                        border->movable = FALSE;
                        error = ft_stroke_border_lineto(border, &delta, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_cubicto(border, &ctrl2, &ctrl1,
                                                         &start);
                        if (error) goto Exit;
                        /* and then move to the endpoint */
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;

                        continue;
                    }

                    /* else fall through */
                }

                /* simply add an arc */
                error = ft_stroke_border_cubicto(border, &ctrl1, &ctrl2, &end);
                if (error) goto Exit;
            }
        }

        arc -= 3;

        stroker->angle_in = angle_out;
    }

    stroker->center = *to;
    stroker->line_length = 0;

Exit:
    return error;
}